

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpIntZext::TypeOpIntZext(TypeOpIntZext *this,TypeFactory *t)

{
  OpBehavior *this_00;
  allocator local_39;
  string local_38 [32];
  TypeFactory *local_18;
  TypeFactory *t_local;
  TypeOpIntZext *this_local;
  
  local_18 = t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"ZEXT",&local_39);
  TypeOpFunc::TypeOpFunc
            (&this->super_TypeOpFunc,t,CPUI_INT_ZEXT,(string *)local_38,TYPE_UINT,TYPE_UINT);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084b338;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x8000;
  this_00 = (OpBehavior *)operator_new(0x10);
  OpBehaviorIntZext::OpBehaviorIntZext((OpBehaviorIntZext *)this_00);
  (this->super_TypeOpFunc).super_TypeOp.behave = this_00;
  return;
}

Assistant:

TypeOpIntZext::TypeOpIntZext(TypeFactory *t)
  : TypeOpFunc(t,CPUI_INT_ZEXT,"ZEXT",TYPE_UINT,TYPE_UINT)
{
  opflags = PcodeOp::unary;
  behave = new OpBehaviorIntZext();
}